

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<QVariant,void(QVariant_const&)>::
reject<QtPromisePrivate::PromiseError_const&>
          (PromiseDataBase<QVariant,void(QVariant_const&)> *this,PromiseError *error)

{
  PromiseError local_20;
  PromiseError *local_18;
  PromiseError *error_local;
  PromiseDataBase<QVariant,_void_(const_QVariant_&)> *this_local;
  
  local_18 = error;
  error_local = (PromiseError *)this;
  PromiseError::PromiseError(&local_20,error);
  PromiseError::operator=((PromiseError *)(this + 0x50),&local_20);
  PromiseError::~PromiseError(&local_20);
  PromiseDataBase<QVariant,_void_(const_QVariant_&)>::setSettled
            ((PromiseDataBase<QVariant,_void_(const_QVariant_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }